

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codebook.c
# Opt level: O2

long vorbis_book_decodev_set(codebook *book,ogg_int32_t *a,oggpack_buffer *b,int n,int point)

{
  long lVar1;
  byte bVar2;
  ogg_int32_t *poVar3;
  long lVar4;
  int iVar5;
  long lVar6;
  
  if (book->used_entries < 1) {
    while (0 < n) {
      lVar1 = book->dim;
      poVar3 = a;
      while (0 < lVar1) {
        *poVar3 = 0;
        poVar3 = poVar3 + 1;
      }
    }
  }
  else {
    iVar5 = point - book->binarypoint;
    bVar2 = (byte)iVar5;
    if (iVar5 < 0) {
      for (iVar5 = 0; iVar5 < n; iVar5 = iVar5 + (int)lVar6) {
        lVar1 = decode_packed_entry_number(book,b);
        if ((int)lVar1 == -1) {
          return -1;
        }
        lVar4 = book->dim;
        lVar1 = (int)lVar1 * lVar4;
        poVar3 = book->valuelist;
        if (lVar4 < 1) {
          lVar4 = 0;
        }
        for (lVar6 = 0; lVar4 != lVar6; lVar6 = lVar6 + 1) {
          a[iVar5 + lVar6] = poVar3[lVar1 + lVar6] << (-bVar2 & 0x1f);
        }
      }
    }
    else {
      for (iVar5 = 0; iVar5 < n; iVar5 = iVar5 + (int)lVar6) {
        lVar1 = decode_packed_entry_number(book,b);
        if ((int)lVar1 == -1) {
          return -1;
        }
        lVar4 = book->dim;
        lVar1 = (int)lVar1 * lVar4;
        poVar3 = book->valuelist;
        if (lVar4 < 1) {
          lVar4 = 0;
        }
        for (lVar6 = 0; lVar4 != lVar6; lVar6 = lVar6 + 1) {
          a[iVar5 + lVar6] = poVar3[lVar1 + lVar6] >> (bVar2 & 0x1f);
        }
      }
    }
  }
  return 0;
}

Assistant:

long vorbis_book_decodev_set(codebook *book,ogg_int32_t *a,
			     oggpack_buffer *b,int n,int point){
  if(book->used_entries>0){
    int i,j,entry;
    ogg_int32_t *t;
    int shift=point-book->binarypoint;
    
    if(shift>=0){
      
      for(i=0;i<n;){
	entry = decode_packed_entry_number(book,b);
	if(entry==-1)return(-1);
	t     = book->valuelist+entry*book->dim;
	for (j=0;j<book->dim;){
	  a[i++]=t[j++]>>shift;
	}
      }
    }else{
      
      for(i=0;i<n;){
	entry = decode_packed_entry_number(book,b);
	if(entry==-1)return(-1);
	t     = book->valuelist+entry*book->dim;
	for (j=0;j<book->dim;){
	  a[i++]=t[j++]<<-shift;
	}
      }
    }
  }else{

    int i,j;
    for(i=0;i<n;){
      for (j=0;j<book->dim;){
	a[i++]=0;
      }
    }
  }
  return(0);
}